

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::GenerateOutputMeshes_3DGS_MDL7
          (MDLImporter *this,IntGroupData_MDL7 *groupData,IntSplitGroupData_MDL7 *splitGroupData)

{
  uint uVar1;
  IntSharedData_MDL7 *pIVar2;
  pointer pIVar3;
  pointer paVar4;
  IntBone_MDL7 *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint weight;
  uint uVar21;
  aiMesh *paVar22;
  ulong *puVar23;
  aiFace *paVar24;
  aiVector3D *paVar25;
  uint *puVar26;
  long lVar27;
  Logger *this_00;
  pointer pvVar28;
  aiBone **ppaVar29;
  aiBone *this_01;
  aiVertexWeight *__s;
  aiFace *paVar30;
  uint iFace_1;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  pointer pvVar34;
  const_iterator k;
  pointer pvVar35;
  uint iFace;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  aiMesh *pcMesh;
  ulong local_488;
  IntBone_MDL7 **local_480;
  IntSplitGroupData_MDL7 *local_478;
  uint local_46c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  aaiVWeightList;
  long local_448;
  uint local_434;
  undefined1 local_430 [1024];
  
  pIVar2 = splitGroupData->shared;
  uVar1 = *(uint *)(this->mBuffer + 8);
  local_46c = uVar1 - 1;
  local_478 = splitGroupData;
  for (uVar33 = 0;
      uVar33 < (ulong)((long)(pIVar2->pcMats).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(pIVar2->pcMats).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3); uVar33 = uVar33 + 1) {
    if ((splitGroupData->aiSplit[uVar33]->
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (splitGroupData->aiSplit[uVar33]->
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar22 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar22);
      paVar22->mPrimitiveTypes = 4;
      paVar22->mMaterialIndex = (uint)uVar33;
      uVar32 = (long)(splitGroupData->aiSplit[uVar33]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(splitGroupData->aiSplit[uVar33]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      uVar31 = (uint)uVar32;
      paVar22->mNumFaces = uVar31;
      uVar38 = uVar32 & 0xffffffff;
      pcMesh = paVar22;
      puVar23 = (ulong *)operator_new__(uVar38 * 0x10 + 8);
      *puVar23 = uVar38;
      paVar24 = (aiFace *)(puVar23 + 1);
      if (uVar38 != 0) {
        paVar30 = paVar24;
        do {
          paVar30->mNumIndices = 0;
          paVar30->mIndices = (uint *)0x0;
          paVar30 = paVar30 + 1;
        } while (paVar30 != paVar24 + uVar38);
      }
      paVar22->mFaces = paVar24;
      paVar22->mNumVertices = uVar31 * 3;
      uVar38 = (ulong)(uVar31 * 3) * 0xc;
      paVar25 = (aiVector3D *)operator_new__(uVar38);
      if (uVar31 != 0) {
        memset(paVar25,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
      }
      paVar22->mVertices = paVar25;
      paVar25 = (aiVector3D *)operator_new__(uVar38);
      if (uVar31 != 0) {
        memset(paVar25,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
      }
      paVar22->mNormals = paVar25;
      if ((groupData->vTextureCoords1).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (groupData->vTextureCoords1).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar22->mNumUVComponents[0] = 2;
        paVar25 = (aiVector3D *)operator_new__(uVar38);
        if (uVar31 != 0) {
          memset(paVar25,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
        }
        paVar22->mTextureCoords[0] = paVar25;
        if ((groupData->vTextureCoords2).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (groupData->vTextureCoords2).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          paVar22->mNumUVComponents[1] = 2;
          paVar25 = (aiVector3D *)operator_new__(uVar38);
          if (uVar31 != 0) {
            memset(paVar25,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
          }
          paVar22->mTextureCoords[1] = paVar25;
        }
      }
      uVar38 = 0;
      local_488 = uVar33;
      for (uVar36 = 0; uVar36 < (uVar32 & 0xffffffff); uVar36 = uVar36 + 1) {
        paVar22->mFaces[uVar36].mNumIndices = 3;
        puVar26 = (uint *)operator_new__(0xc);
        pcMesh->mFaces[uVar36].mIndices = puVar26;
        uVar31 = (local_478->aiSplit[local_488]->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar36];
        pIVar3 = (groupData->pcFaces).
                 super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (lVar27 = 0; lVar27 != 3; lVar27 = lVar27 + 1) {
          uVar21 = pIVar3[uVar31].mIndices[lVar27];
          paVar4 = (groupData->vPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          paVar25 = pcMesh->mVertices;
          uVar33 = uVar38 + lVar27 & 0xffffffff;
          paVar25[uVar33].z = paVar4[uVar21].z;
          paVar4 = paVar4 + uVar21;
          fVar6 = paVar4->y;
          paVar25 = paVar25 + uVar33;
          paVar25->x = paVar4->x;
          paVar25->y = fVar6;
          paVar4 = (groupData->vNormals).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          paVar25 = pcMesh->mNormals;
          paVar25[uVar33].z = paVar4[uVar21].z;
          paVar4 = paVar4 + uVar21;
          fVar6 = paVar4->y;
          paVar25 = paVar25 + uVar33;
          paVar25->x = paVar4->x;
          paVar25->y = fVar6;
          paVar4 = (groupData->vTextureCoords1).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (paVar4 != (groupData->vTextureCoords1).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            paVar25 = pcMesh->mTextureCoords[0];
            paVar25[uVar33].z = paVar4[uVar21].z;
            fVar6 = paVar4[uVar21].y;
            paVar25 = paVar25 + uVar33;
            paVar25->x = paVar4[uVar21].x;
            paVar25->y = fVar6;
            paVar4 = (groupData->vTextureCoords2).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (paVar4 != (groupData->vTextureCoords2).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              paVar25 = pcMesh->mTextureCoords[1];
              paVar25[uVar33].z = paVar4[uVar21].z;
              fVar6 = paVar4[uVar21].y;
              paVar25 = paVar25 + uVar33;
              paVar25->x = paVar4[uVar21].x;
              paVar25->y = fVar6;
            }
          }
          pcMesh->mFaces[uVar36].mIndices[lVar27] = (uint)(uVar38 + lVar27);
        }
        uVar32 = (ulong)pcMesh->mNumFaces;
        uVar38 = (ulong)((int)uVar38 + 3);
        paVar22 = pcMesh;
      }
      if ((groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        aaiVWeightList.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        aaiVWeightList.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        aaiVWeightList.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize(&aaiVWeightList,(ulong)uVar1);
        iVar37 = 0;
        for (uVar33 = 0;
            pvVar34 = aaiVWeightList.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            pvVar35 = aaiVWeightList.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, paVar22 = pcMesh,
            pvVar28 = aaiVWeightList.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, uVar33 < pcMesh->mNumFaces;
            uVar33 = uVar33 + 1) {
          uVar31 = (local_478->aiSplit[local_488]->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar33];
          pIVar3 = (groupData->pcFaces).
                   super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          for (lVar27 = 0; lVar27 != 3; lVar27 = lVar27 + 1) {
            uVar21 = (groupData->aiBones).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[pIVar3[uVar31].mIndices[lVar27]];
            if (uVar21 != 0xffffffff) {
              if (uVar1 <= uVar21) {
                this_00 = DefaultLogger::get();
                Logger::error(this_00,
                              "Bone index overflow. The bone index of a vertex exceeds the allowed range. "
                             );
                uVar21 = local_46c;
              }
              local_434 = iVar37 + (int)lVar27;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (aaiVWeightList.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar21,&local_434);
            }
          }
          iVar37 = iVar37 + 3;
        }
        for (; pvVar28 !=
               aaiVWeightList.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; pvVar28 = pvVar28 + 1) {
          if ((pvVar28->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start !=
              (pvVar28->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            pcMesh->mNumBones = pcMesh->mNumBones + 1;
          }
        }
        ppaVar29 = (aiBone **)operator_new__((ulong)pcMesh->mNumBones << 3);
        paVar22->mBones = ppaVar29;
        local_448 = 0;
        for (; pvVar35 != pvVar34; pvVar35 = pvVar35 + 1) {
          if ((pvVar35->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start !=
              (pvVar35->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            this_01 = (aiBone *)operator_new(0x450);
            aiBone::aiBone(this_01);
            pcMesh->mBones[local_448] = this_01;
            local_480 = pIVar2->apcOutBones;
            uVar31 = (local_480[local_448]->super_aiBone).mName.length;
            if (0x3fe < uVar31) {
              uVar31 = 0x3ff;
            }
            uVar33 = (ulong)uVar31;
            local_434 = uVar31;
            memcpy(local_430,(local_480[local_448]->super_aiBone).mName.data,uVar33);
            local_430[uVar33] = 0;
            (this_01->mName).length = uVar31;
            memcpy((this_01->mName).data,local_430,uVar33);
            (this_01->mName).data[uVar33] = '\0';
            pIVar5 = local_480[local_448];
            fVar17 = (pIVar5->super_aiBone).mOffsetMatrix.a1;
            fVar18 = (pIVar5->super_aiBone).mOffsetMatrix.a2;
            fVar19 = (pIVar5->super_aiBone).mOffsetMatrix.a3;
            fVar20 = (pIVar5->super_aiBone).mOffsetMatrix.a4;
            fVar13 = (pIVar5->super_aiBone).mOffsetMatrix.b1;
            fVar14 = (pIVar5->super_aiBone).mOffsetMatrix.b2;
            fVar15 = (pIVar5->super_aiBone).mOffsetMatrix.b3;
            fVar16 = (pIVar5->super_aiBone).mOffsetMatrix.b4;
            fVar9 = (pIVar5->super_aiBone).mOffsetMatrix.c1;
            fVar10 = (pIVar5->super_aiBone).mOffsetMatrix.c2;
            fVar11 = (pIVar5->super_aiBone).mOffsetMatrix.c3;
            fVar12 = (pIVar5->super_aiBone).mOffsetMatrix.c4;
            fVar6 = (pIVar5->super_aiBone).mOffsetMatrix.d2;
            fVar7 = (pIVar5->super_aiBone).mOffsetMatrix.d3;
            fVar8 = (pIVar5->super_aiBone).mOffsetMatrix.d4;
            (this_01->mOffsetMatrix).d1 = (pIVar5->super_aiBone).mOffsetMatrix.d1;
            (this_01->mOffsetMatrix).d2 = fVar6;
            (this_01->mOffsetMatrix).d3 = fVar7;
            (this_01->mOffsetMatrix).d4 = fVar8;
            (this_01->mOffsetMatrix).c1 = fVar9;
            (this_01->mOffsetMatrix).c2 = fVar10;
            (this_01->mOffsetMatrix).c3 = fVar11;
            (this_01->mOffsetMatrix).c4 = fVar12;
            (this_01->mOffsetMatrix).b1 = fVar13;
            (this_01->mOffsetMatrix).b2 = fVar14;
            (this_01->mOffsetMatrix).b3 = fVar15;
            (this_01->mOffsetMatrix).b4 = fVar16;
            (this_01->mOffsetMatrix).a1 = fVar17;
            (this_01->mOffsetMatrix).a2 = fVar18;
            (this_01->mOffsetMatrix).a3 = fVar19;
            (this_01->mOffsetMatrix).a4 = fVar20;
            uVar33 = (long)(pvVar35->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar35->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2;
            this_01->mNumWeights = (uint)uVar33;
            local_480 = (IntBone_MDL7 **)((uVar33 & 0xffffffff) * 8);
            __s = (aiVertexWeight *)operator_new__((ulong)local_480);
            if ((uVar33 & 0xffffffff) != 0) {
              memset(__s,0,(size_t)local_480);
            }
            this_01->mWeights = __s;
            for (uVar32 = 0;
                pvVar34 = aaiVWeightList.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish, uVar32 < (uVar33 & 0xffffffff)
                ; uVar32 = uVar32 + 1) {
              this_01->mWeights[uVar32].mVertexId =
                   (pvVar35->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar32];
              this_01->mWeights[uVar32].mWeight = 1.0;
              uVar33 = (ulong)this_01->mNumWeights;
            }
          }
          local_448 = local_448 + 1;
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&aaiVWeightList);
      }
      splitGroupData = local_478;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(local_478->avOutList,&pcMesh);
      uVar33 = local_488;
    }
  }
  return;
}

Assistant:

void MDLImporter::GenerateOutputMeshes_3DGS_MDL7(
    MDL::IntGroupData_MDL7& groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const MDL::IntSharedData_MDL7& shared = splitGroupData.shared;

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const unsigned int iNumOutBones = pcHeader->bones_num;

    for (std::vector<aiMaterial*>::size_type i = 0; i < shared.pcMats.size();++i)   {
        if (!splitGroupData.aiSplit[i]->empty())    {

            // allocate the output mesh
            aiMesh* pcMesh = new aiMesh();

            pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
            pcMesh->mMaterialIndex = (unsigned int)i;

            // allocate output storage
            pcMesh->mNumFaces = (unsigned int)splitGroupData.aiSplit[i]->size();
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            pcMesh->mNumVertices = pcMesh->mNumFaces*3;
            pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

            if (!groupData.vTextureCoords1.empty()) {
                pcMesh->mNumUVComponents[0] = 2;
                pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
                if (!groupData.vTextureCoords2.empty()) {
                    pcMesh->mNumUVComponents[1] = 2;
                    pcMesh->mTextureCoords[1] = new aiVector3D[pcMesh->mNumVertices];
                }
            }

            // iterate through all faces and build an unique set of vertices
            unsigned int iCurrent = 0;
            for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                pcMesh->mFaces[iFace].mNumIndices = 3;
                pcMesh->mFaces[iFace].mIndices = new unsigned int[3];

                unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                // iterate through all face indices
                for (unsigned int c = 0; c < 3;++c) {
                    const uint32_t iIndex = oldFace.mIndices[c];
                    pcMesh->mVertices[iCurrent] = groupData.vPositions[iIndex];
                    pcMesh->mNormals[iCurrent] = groupData.vNormals[iIndex];

                    if (!groupData.vTextureCoords1.empty()) {

                        pcMesh->mTextureCoords[0][iCurrent] = groupData.vTextureCoords1[iIndex];
                        if (!groupData.vTextureCoords2.empty()) {
                            pcMesh->mTextureCoords[1][iCurrent] = groupData.vTextureCoords2[iIndex];
                        }
                    }
                    pcMesh->mFaces[iFace].mIndices[c] = iCurrent++;
                }
            }

            // if we have bones in the mesh we'll need to generate
            // proper vertex weights for them
            if (!groupData.aiBones.empty()) {
                std::vector<std::vector<unsigned int> > aaiVWeightList;
                aaiVWeightList.resize(iNumOutBones);

                int iCurrent = 0;
                for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                    unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                    const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                    // iterate through all face indices
                    for (unsigned int c = 0; c < 3;++c) {
                        unsigned int iBone = groupData.aiBones[ oldFace.mIndices[c] ];
                        if (UINT_MAX != iBone)  {
                            if (iBone >= iNumOutBones)  {
                                ASSIMP_LOG_ERROR("Bone index overflow. "
                                    "The bone index of a vertex exceeds the allowed range. ");
                                iBone = iNumOutBones-1;
                            }
                            aaiVWeightList[ iBone ].push_back ( iCurrent );
                        }
                        ++iCurrent;
                    }
                }
                // now check which bones are required ...
                for (std::vector<std::vector<unsigned int> >::const_iterator k =  aaiVWeightList.begin();k != aaiVWeightList.end();++k) {
                    if (!(*k).empty()) {
                        ++pcMesh->mNumBones;
                    }
                }
                pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
                iCurrent = 0;
                for (std::vector<std::vector<unsigned int> >::const_iterator k = aaiVWeightList.begin();k!= aaiVWeightList.end();++k,++iCurrent)
                {
                    if ((*k).empty())
                        continue;

                    // seems we'll need this node
                    aiBone* pcBone = pcMesh->mBones[ iCurrent ] = new aiBone();
                    pcBone->mName = aiString(shared.apcOutBones[ iCurrent ]->mName);
                    pcBone->mOffsetMatrix = shared.apcOutBones[ iCurrent ]->mOffsetMatrix;

                    // setup vertex weights
                    pcBone->mNumWeights = (unsigned int)(*k).size();
                    pcBone->mWeights = new aiVertexWeight[pcBone->mNumWeights];

                    for (unsigned int weight = 0; weight < pcBone->mNumWeights;++weight)    {
                        pcBone->mWeights[weight].mVertexId = (*k)[weight];
                        pcBone->mWeights[weight].mWeight = 1.0f;
                    }
                }
            }
            // add the mesh to the list of output meshes
            splitGroupData.avOutList.push_back(pcMesh);
        }
    }
}